

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

void Omega_h::expand_into<long>
               (Read<signed_char> *a_data,LOs *a2b,Write<signed_char> *b_data,Int width)

{
  Write<signed_char> *pWVar1;
  Alloc *pAVar2;
  ulong uVar3;
  uint n;
  size_t sVar4;
  int iVar5;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_d9;
  Write<int> *local_d8;
  Write<signed_char> *local_d0;
  type f;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0 = b_data;
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_d9);
  std::operator+(&local_50,&local_70,":");
  std::__cxx11::to_string(&local_90,0x6a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&local_50,
                 &local_90);
  begin_code("expand_into",(char *)f.a2b.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pWVar1 = local_d0;
  pAVar2 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar4 = pAVar2->size;
  }
  else {
    sVar4 = (ulong)pAVar2 >> 3;
  }
  n = (int)(sVar4 >> 2) - 1;
  pAVar2 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar3 = pAVar2->size >> 3;
    iVar5 = n * width;
    if (iVar5 == (int)uVar3) goto LAB_002b8986;
  }
  else {
    iVar5 = (int)((ulong)pAVar2 >> 6);
    local_d8 = &a2b->write_;
    if (n * width == iVar5) goto LAB_002b8986;
    uVar3 = (ulong)pAVar2 >> 6 & 0xffffffff;
  }
  iVar5 = n * width;
  local_d8 = &a2b->write_;
  printf("This error can happen when an array has been subsetted - check sync_array usage vs sync_subset_array:\n a_data.size= %d na= %d width= %d"
         ,uVar3,(ulong)n,(ulong)(uint)width);
  pAVar2 = (a_data->write_).shared_alloc_.alloc;
  a2b = (LOs *)local_d8;
LAB_002b8986:
  if (((ulong)pAVar2 & 1) == 0) {
    uVar3 = pAVar2->size >> 3;
  }
  else {
    uVar3 = (ulong)pAVar2 >> 6;
  }
  if (iVar5 != (int)uVar3) {
    printf("ERROR: a_data.size= %d na= %d width= %d\n",uVar3,(ulong)n,(ulong)(uint)width);
    pAVar2 = (a_data->write_).shared_alloc_.alloc;
  }
  if (((ulong)pAVar2 & 1) == 0) {
    uVar3 = pAVar2->size;
  }
  else {
    uVar3 = (ulong)pAVar2 >> 3;
  }
  if (iVar5 != (int)(uVar3 >> 3)) {
    fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
         ,0x6e);
  }
  Write<int>::Write((Write<int> *)&f,&a2b->write_);
  f.width = width;
  Write<long>::Write((Write<int> *)&f.b_data,(Write<int> *)pWVar1);
  Write<long>::Write((Write<int> *)&f.a_data,(Write<int> *)a_data);
  parallel_for<Omega_h::expand_into<long>(Omega_h::Read<long>,Omega_h::Read<int>,Omega_h::Write<long>,int)::_lambda(int)_1_>
            (n,&f);
  expand_into<long>(Omega_h::Read<long>,Omega_h::Read<int>,Omega_h::Write<long>,int)::
  {lambda(int)#1}::~Write((_lambda_int__1_ *)&f);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return;
}

Assistant:

void expand_into(Read<T> a_data, LOs a2b, Write<T> b_data, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto na = a2b.size() - 1;
  if(a_data.size() != na * width) printf("This error can happen when an array has been subsetted - check sync_array usage vs sync_subset_array:\n"
                                         " a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  OMEGA_H_CHECK_PRINTF(a_data.size() == na * width, "a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    for (auto b = a2b[a]; b < a2b[a + 1]; ++b) {
      for (Int j = 0; j < width; ++j) {
        b_data[b * width + j] = a_data[a * width + j];
      }
    }
  };
  parallel_for(na, std::move(f));
}